

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk24(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk24_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk24.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk24.version);
    if ((bios->power).unk24.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk24.offset + 1,&(bios->power).unk24.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk24.offset + 2,&(bios->power).unk24.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk24.offset + 3,&(bios->power).unk24.entriesnum);
      (bios->power).unk24.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk24.entriesnum;
      peVar5 = (envy_bios_power_unk24_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk24.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk24.rlen * (int)uVar6 +
             (uint)(bios->power).unk24.hlen + (bios->power).unk24.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown VENTURA table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk24(struct envy_bios *bios) {
	struct envy_bios_power_unk24 *unk24 = &bios->power.unk24;
	int i, err = 0;

	if (!unk24->offset)
		return -EINVAL;

	bios_u8(bios, unk24->offset + 0x0, &unk24->version);
	switch(unk24->version) {
	case 0x10:
		err |= bios_u8(bios, unk24->offset + 0x1, &unk24->hlen);
		err |= bios_u8(bios, unk24->offset + 0x2, &unk24->rlen);
		err |= bios_u8(bios, unk24->offset + 0x3, &unk24->entriesnum);
		unk24->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown VENTURA table version 0x%x\n", unk24->version);
		return -EINVAL;
	};

	err = 0;
	unk24->entries = malloc(unk24->entriesnum * sizeof(struct envy_bios_power_unk24_entry));
	for (i = 0; i < unk24->entriesnum; i++) {
		uint32_t data = unk24->offset + unk24->hlen + i * unk24->rlen;

		unk24->entries[i].offset = data;
	}

	return 0;
}